

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

void Super_AddGateToTable(Super_Man_t *pMan,Super_Gate_t_conflict *pGate)

{
  int iVar1;
  ABC_PTRUINT_T Key;
  Super_Gate_t_conflict **ppList;
  Super_Gate_t_conflict *pGate_local;
  Super_Man_t *pMan_local;
  
  ppList = (Super_Gate_t_conflict **)pGate;
  pGate_local = (Super_Gate_t_conflict *)pMan;
  iVar1 = stmm_find_or_add(pMan->tTable,(char *)(ulong)(pGate->uTruth[0] ^ pGate->uTruth[1]),
                           (char ***)&Key);
  if (iVar1 == 0) {
    *(undefined8 *)Key = 0;
    *(int *)((long)pGate_local[1].pFanins + 0x2c) =
         *(int *)((long)pGate_local[1].pFanins + 0x2c) + 1;
  }
  ppList[0xd] = *(Super_Gate_t_conflict **)Key;
  *(Super_Gate_t_conflict ***)Key = ppList;
  *(int *)((long)pGate_local[1].pFanins + 0x24) = *(int *)((long)pGate_local[1].pFanins + 0x24) + 1;
  return;
}

Assistant:

void Super_AddGateToTable( Super_Man_t * pMan, Super_Gate_t * pGate )
{
    Super_Gate_t ** ppList;
    ABC_PTRUINT_T Key;
//    Key = pGate->uTruth[0] + 2003 * pGate->uTruth[1];
    Key = pGate->uTruth[0] ^ pGate->uTruth[1];
    if ( !stmm_find_or_add( pMan->tTable, (char *)Key, (char ***)&ppList ) )
    {
        *ppList = NULL;
        pMan->nClasses++;
    }
    pGate->pNext = *ppList;
    *ppList = pGate;
    pMan->nAdded++;
}